

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

void __thiscall
duckdb::StringValueScanner::StringValueScanner
          (StringValueScanner *this,idx_t scanner_idx_p,
          shared_ptr<duckdb::CSVBufferManager,_true> *buffer_manager,
          shared_ptr<duckdb::CSVStateMachine,_true> *state_machine,
          shared_ptr<duckdb::CSVErrorHandler,_true> *error_handler,
          shared_ptr<duckdb::CSVFileScan,_true> *csv_file_scan,bool sniffing,CSVIterator *boundary,
          idx_t result_size)

{
  bool store_line_size_p;
  CSVBufferManager *pCVar1;
  Allocator *buffer_allocator;
  type error_hander_p;
  pointer pCVar2;
  CSVStateMachine *pCVar3;
  shared_ptr<duckdb::CSVFileScan,_true> local_b8;
  shared_ptr<duckdb::CSVFileScan,_true> local_a8;
  shared_ptr<duckdb::CSVErrorHandler,_true> local_98;
  shared_ptr<duckdb::CSVStateMachine,_true> local_88;
  shared_ptr<duckdb::CSVBufferManager,_true> local_78;
  idx_t local_68;
  type local_60;
  ulong local_58;
  string local_50;
  
  local_78.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (buffer_manager->internal).
         super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (buffer_manager->internal).
       super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_78.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_78.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_78.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_88.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (state_machine->internal).
       super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (state_machine->internal).
       super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_88.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_88.internal.
            super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_88.internal.
            super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_98.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (error_handler->internal).
       super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (error_handler->internal).
       super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_98.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_98.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.internal.
            super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_98.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.internal.
            super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_a8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (csv_file_scan->internal).super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_a8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (csv_file_scan->internal).
          super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_a8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_58 = (ulong)sniffing;
  BaseScanner::BaseScanner
            (&this->super_BaseScanner,&local_78,&local_88,&local_98,sniffing,&local_a8,boundary);
  if (local_a8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_98.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.internal.
               super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.internal.
               super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.internal.
               super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  (this->super_BaseScanner)._vptr_BaseScanner = (_func_int **)&PTR__StringValueScanner_0249a310;
  this->scanner_idx = scanner_idx_p;
  (this->buffer_tracker).internal.
  super___shared_ptr<duckdb::CSVBufferUsage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->buffer_tracker).internal.
  super___shared_ptr<duckdb::CSVBufferUsage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60 = shared_ptr<duckdb::CSVStateMachine,_true>::operator*(state_machine);
  pCVar1 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(buffer_manager);
  buffer_allocator = BufferAllocator::Get(pCVar1->context);
  local_68 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  error_hander_p = shared_ptr<duckdb::CSVErrorHandler,_true>::operator*(error_handler);
  pCVar1 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(buffer_manager);
  pCVar2 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::operator->
                     (&pCVar1->context->client_data);
  store_line_size_p = pCVar2->debug_set_max_line_length;
  local_b8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (csv_file_scan->internal).super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_b8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (csv_file_scan->internal).
          super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_b8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_b8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_b8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pCVar1 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(buffer_manager);
  CSVBufferManager::GetFilePath_abi_cxx11_(&local_50,pCVar1);
  StringValueResult::StringValueResult
            (&this->result,&(this->super_BaseScanner).states,local_60,
             &(this->super_BaseScanner).cur_buffer_handle,buffer_allocator,result_size,local_68,
             error_hander_p,&(this->super_BaseScanner).iterator,store_line_size_p,&local_b8,
             &(this->super_BaseScanner).lines_read,SUB81(local_58,0),&local_50,scanner_idx_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_b8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  (this->state_machine_strict).internal.
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->state_machine_strict).internal.
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->previous_buffer_handle).internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->previous_buffer_handle).internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->start_pos = 0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar3 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(state_machine);
  (this->super_BaseScanner).iterator.buffer_size = (pCVar3->options->buffer_size_option).value;
  return;
}

Assistant:

StringValueScanner::StringValueScanner(idx_t scanner_idx_p, const shared_ptr<CSVBufferManager> &buffer_manager,
                                       const shared_ptr<CSVStateMachine> &state_machine,
                                       const shared_ptr<CSVErrorHandler> &error_handler,
                                       const shared_ptr<CSVFileScan> &csv_file_scan, bool sniffing,
                                       const CSVIterator &boundary, idx_t result_size)
    : BaseScanner(buffer_manager, state_machine, error_handler, sniffing, csv_file_scan, boundary),
      scanner_idx(scanner_idx_p),
      result(states, *state_machine, cur_buffer_handle, BufferAllocator::Get(buffer_manager->context), result_size,
             iterator.pos.buffer_pos, *error_handler, iterator,
             buffer_manager->context.client_data->debug_set_max_line_length, csv_file_scan, lines_read, sniffing,
             buffer_manager->GetFilePath(), scanner_idx_p),
      start_pos(0) {
	iterator.buffer_size = state_machine->options.buffer_size_option.GetValue();
}